

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-fight-attack.c
# Opt level: O3

wchar_t borg_launch_bolt_aux_hack(wchar_t i,wchar_t dam,wchar_t typ,wchar_t ammo_location)

{
  bitflag *pbVar1;
  monster_race *r_ptr;
  ushort uVar2;
  ushort uVar3;
  short sVar4;
  short sVar5;
  monster_blow *pmVar6;
  blow_effect *pbVar7;
  loc_conflict grid1;
  loc_conflict grid1_00;
  loc_conflict grid1_01;
  monster_race *pmVar8;
  borg_kill *pbVar9;
  borg_kill *pbVar10;
  borg_item_conflict *pbVar11;
  int *piVar12;
  _Bool _Var13;
  _Bool _Var14;
  bool bVar15;
  int16_t iVar16;
  wchar_t wVar17;
  int iVar18;
  wchar_t wVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  void *pvVar22;
  bool bVar23;
  int iVar24;
  _Bool *p_Var25;
  bitflag *flags;
  long lVar26;
  int iVar27;
  uint uVar28;
  char *pcVar29;
  long lVar30;
  borg_grid *ag;
  borg_item *obj;
  wchar_t local_58;
  wchar_t local_50;
  
  pbVar9 = borg_kills;
  pmVar8 = r_info;
  uVar2 = borg_kills[(uint)i].r_idx;
  if ((ulong)uVar2 == 0) {
    return L'\0';
  }
  if ((int)(z_info->r_max - 1) <= (int)(uint)uVar2) {
    return L'\0';
  }
  if ((int)borg_kills[(uint)i].when < borg_t + -2) {
    return L'\0';
  }
  local_50 = borg_kills[(uint)i].pos.x;
  local_58 = borg_kills[(uint)i].pos.y;
  ag = borg_grids[local_58] + local_50;
  _Var13 = borg_cave_floor_grid(ag);
  if (!_Var13) {
    return L'\0';
  }
  _Var13 = flag_has_dbg(pmVar8[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  if ((_Var13) &&
     (((4 < ag->feat || ((0x1aU >> (ag->feat & 0x1f) & 1) == 0)) && (ag->trap != true)))) {
    return L'\0';
  }
  _Var13 = flag_has_dbg(pmVar8[uVar2].flags,0xb,0x2e,"r_ptr->flags","RF_PASS_WALL");
  pbVar10 = borg_kills;
  pmVar8 = r_info;
  if (_Var13) {
    wVar21 = pbVar9[(uint)i].pos.x;
    local_58 = pbVar9[(uint)i].pos.y;
    local_50 = wVar21 + L'\x01';
    iVar24 = 0;
    lVar26 = -1;
    iVar27 = 0;
    do {
      lVar30 = -1;
      do {
        iVar27 = iVar27 + (uint)((byte)(borg_grids[local_58 + lVar30][lVar26 + wVar21].feat - 0x11)
                                < 6);
        iVar24 = iVar24 + (uint)(borg_grids[local_58 + lVar30][lVar26 + wVar21].feat == '\0');
        lVar30 = lVar30 + 1;
      } while (lVar30 != 2);
      lVar26 = lVar26 + 1;
    } while (lVar26 != 2);
    local_58 = local_58 + L'\x01';
    if ((1 < iVar27) && (0 < iVar24)) {
      return L'\0';
    }
  }
  uVar2 = borg_kills[(uint)i].r_idx;
  if ((int)(z_info->r_max - 1) <= (int)(uint)uVar2) {
    return L'\0';
  }
  r_ptr = r_info + uVar2;
  grid1.y = borg.c.y;
  grid1.x = borg.c.x;
  wVar17 = distance(grid1,(loc_conflict)borg_kills[(uint)i].pos);
  piVar12 = borg.trait;
  pbVar11 = borg_items;
  iVar24 = borg.trait[0x3d];
  iVar27 = borg.trait[0x86];
  uVar3 = z_info->pack_size;
  sVar4 = borg_items[(ulong)uVar3 + 1].to_h;
  sVar5 = borg_items[ammo_location].to_h;
  wVar21 = pmVar8[uVar2].ac;
  pmVar6 = pmVar8[uVar2].blow;
  lVar26 = 0;
  bVar23 = false;
  do {
    pbVar7 = pmVar6[lVar26].effect;
    if (pbVar7 != (blow_effect *)0x0) {
      pcVar29 = pbVar7->name;
      lVar30 = 8;
      do {
        iVar18 = strcmp(pcVar29,*(char **)(&UNK_002d10e8 + lVar30));
        if (iVar18 == 0) {
          bVar23 = (bool)(bVar23 | *(int *)((long)&borg_mon_blow_effect::monblow[0].name + lVar30)
                                   == 5);
          break;
        }
        lVar30 = lVar30 + 0x10;
      } while (lVar30 != 0x1f8);
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 4);
  wVar20 = dam;
  if (0x39 < (uint)(typ + L'\xffffffff')) goto switchD_0020d99b_caseD_3;
  switch(typ) {
  case L'\x01':
    obj = (borg_item *)(pbVar11 + ammo_location);
    wVar19 = borg_best_mult((borg_item *)(pbVar11 + (ulong)uVar3 + 1),r_ptr);
    wVar20 = borg_best_mult(obj,r_ptr);
    if (wVar19 < wVar20) {
      wVar19 = borg_best_mult(obj,r_ptr);
    }
    wVar19 = wVar19 * dam;
    if ((wVar17 == L'\x01') &&
       (_Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      wVar19 = wVar19 / 5;
    }
    wVar20 = L'\0';
    if (((wVar21 + wVar17) * 8) / 10 <= (iVar27 + sVar4 + (int)sVar5) * 3 + iVar24) {
      wVar20 = wVar19;
    }
    break;
  case L'\x02':
    if (borg_fighting_unique == L'\0') goto switchD_0020d99b_caseD_3;
    bVar15 = 3 < borg.has[kv_potion_restore_mana];
    goto LAB_0020e485;
  case L'\x03':
    goto switchD_0020d99b_caseD_3;
  case L'\x04':
    pcVar29 = "RF_IM_ACID";
    iVar24 = 0x45;
    goto LAB_0020e2e2;
  case L'\x05':
    pcVar29 = "RF_IM_ELEC";
    iVar24 = 0x46;
    goto LAB_0020e2e2;
  case L'\x06':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x47,"r_ptr->flags","RF_IM_FIRE");
    if (_Var13) {
      dam = L'\0';
    }
    pcVar29 = "RF_HURT_FIRE";
    iVar24 = 0x43;
    goto LAB_0020e342;
  case L'\a':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x48,"r_ptr->flags","RF_IM_COLD");
    if (_Var13) {
      dam = L'\0';
    }
    pcVar29 = "RF_HURT_COLD";
    iVar24 = 0x44;
LAB_0020e342:
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,iVar24,"r_ptr->flags",pcVar29);
    wVar20 = dam << _Var13;
    break;
  case L'\b':
    pcVar29 = "RF_IM_POIS";
    iVar24 = 0x49;
    goto LAB_0020e2e2;
  case L'\t':
    pcVar29 = "RF_IM_COLD";
    iVar24 = 0x48;
    goto LAB_0020e2e2;
  case L'\n':
    bVar15 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
LAB_0020e485:
    wVar20 = dam << bVar15;
    break;
  case L'\v':
    pcVar29 = "RF_UNDEAD";
    iVar24 = 0x3e;
    goto LAB_0020e755;
  case L'\f':
  case L'\x0f':
    pcVar29 = "RF_EVIL";
    iVar24 = 0x3d;
    goto LAB_0020e755;
  case L'\r':
    pcVar29 = "RF_SPIRIT";
    iVar24 = 0x1b;
    goto LAB_0020e755;
  case L'\x0e':
  case L'3':
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,0x52,"r_ptr->flags","RF_NO_SLEEP");
    wVar20 = L'\0';
    if (((!_Var13) &&
        ((_Var13 = flag_has_dbg(pbVar1,0xb,0x3d,"r_ptr->flags","RF_EVIL"), typ != L'\x0e' ||
         (_Var13)))) &&
       ((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed &&
        ((pbVar10[(uint)i].confused == false && (pbVar10[(uint)i].awake == true)))))) {
      iVar24 = 10;
      if (0xc < borg.trait[0x23]) {
        iVar24 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
      }
      if (pbVar10[(uint)i].level <= iVar24) {
        _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar20 = L'\xfffffc19';
        if (!_Var13) {
          p_Var25 = &borg_sleep_spell;
LAB_0020ea33:
          *p_Var25 = false;
          wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
          wVar21 = wVar17;
          if ((pbVar10[(uint)i].afraid == true) &&
             (wVar21 = wVar17 + L'\x14', 10 < borg.trait[0x23])) {
            wVar21 = wVar17;
          }
          *p_Var25 = true;
          wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
          *p_Var25 = false;
          goto LAB_0020eab6;
        }
      }
    }
    break;
  case L'\x10':
    pcVar29 = "RF_HURT_LIGHT";
    iVar24 = 0x41;
    goto LAB_0020e755;
  case L'\x11':
    grid1_00.y = borg.c.y;
    grid1_00.x = borg.c.x;
    wVar21 = distance(grid1_00,(loc_conflict)pbVar10[(uint)i].pos);
    wVar20 = dam / 5;
    if (wVar21 != L'\x01') {
      wVar20 = dam;
    }
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (((_Var13) ||
        (_Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3b,"r_ptr->flags","RF_DEMON"), _Var13)) ||
       (pvVar22 = memchr("Egv",r_ptr->d_char,4), pvVar22 != (void *)0x0))
    goto switchD_0020d99b_caseD_22;
    break;
  case L'\x12':
    pcVar29 = "RF_HURT_ROCK";
    iVar24 = 0x42;
LAB_0020e755:
    bVar15 = flag_has_dbg(r_ptr->flags,0xb,iVar24,"r_ptr->flags",pcVar29);
LAB_0020e75f:
    wVar20 = L'\0';
    if (bVar15 != false) {
      wVar20 = dam;
    }
    break;
  case L'\x13':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (_Var13) goto switchD_0020d99b_caseD_22;
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0xc,"r_ptr->spell_flags","RSF_BR_NETH");
    if (!_Var13) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
      if (_Var13) {
        iVar24 = dam - (dam >> 0x1f);
        goto LAB_0020dd39;
      }
      goto switchD_0020d99b_caseD_3;
    }
    goto LAB_0020e88f;
  case L'\x14':
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0x10,"r_ptr->spell_flags","RSF_BR_CHAO");
    wVar21 = dam / 3;
    if (!_Var13) {
      wVar21 = dam;
    }
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar20 = L'\xfffffc19';
    if (_Var13) {
      wVar20 = wVar21;
    }
    break;
  case L'\x15':
    pcVar29 = "RSF_BR_GRAV";
    iVar24 = 0x15;
    goto LAB_0020e882;
  case L'\x16':
    pcVar29 = "RSF_BR_SHAR";
    iVar24 = 0x16;
    goto LAB_0020e882;
  case L'\x17':
    pcVar29 = "RSF_BR_SOUN";
    iVar24 = 0xf;
    goto LAB_0020e882;
  case L'\x18':
    pcVar29 = "RSF_BR_PLAS";
    iVar24 = 0x17;
    goto LAB_0020e882;
  case L'\x19':
    pcVar29 = "RF_NO_CONF";
    iVar24 = 0x51;
LAB_0020e2e2:
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,iVar24,"r_ptr->flags",pcVar29);
    if (_Var13) {
      wVar20 = L'\0';
    }
    break;
  case L'\x1a':
    pcVar29 = "RSF_BR_DISE";
    iVar24 = 0x11;
    goto LAB_0020e882;
  case L'\x1b':
    pcVar29 = "RSF_BR_NEXU";
    iVar24 = 0x12;
    goto LAB_0020e882;
  case L'\x1c':
    pcVar29 = "RSF_BR_WALL";
    iVar24 = 0x18;
    goto LAB_0020e882;
  case L'\x1d':
    pcVar29 = "RSF_BR_INER";
    iVar24 = 0x14;
    goto LAB_0020e882;
  case L'\x1e':
    pcVar29 = "RSF_BR_TIME";
    iVar24 = 0x13;
    goto LAB_0020e882;
  case L'\x1f':
    pcVar29 = "RSF_BR_LIGHT";
    iVar24 = 0xd;
    goto LAB_0020e882;
  case L' ':
    pcVar29 = "RSF_BR_DARK";
    iVar24 = 0xe;
LAB_0020e882:
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,iVar24,"r_ptr->spell_flags",pcVar29);
    if (_Var13) {
LAB_0020e88f:
      wVar20 = dam / 3;
    }
    else {
switchD_0020d99b_caseD_3:
      wVar20 = dam;
    }
    break;
  case L'!':
    _Var13 = flag_has_dbg(r_ptr->spell_flags,0xc,0x23,"r_ptr->spell_flags","RSF_BA_WATE");
    wVar21 = dam / 3;
    if (!_Var13) {
      wVar21 = dam;
    }
    iVar24 = wVar21 - (wVar21 >> 0x1f);
    goto LAB_0020dd39;
  default:
switchD_0020d99b_caseD_22:
    wVar20 = L'\0';
    break;
  case L'-':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    if (_Var13) {
      wVar20 = L'\xffffd8f1';
      if ((0x3b < pbVar10[(uint)i].injury) || (borg_as_position != false)) break;
      if ((((dam <= (avoidance * 0xd) / 10) || (0x62 < borg.trait[0x69])) &&
          (6 < (uint)(borg_fighting_unique + L'\xfffffffe'))) &&
         ((borg.trait[0x19] != 1 ||
          (grid1_01.y = borg.c.y, grid1_01.x = borg.c.x,
          wVar21 = distance(grid1_01,(loc_conflict)pbVar10[(uint)i].pos), L'\x02' < wVar21)))) {
        wVar20 = L'\xfffffc19';
        if (vault_on_level != true) break;
        lVar26 = 0;
        uVar28 = 0;
        do {
          uVar28 = uVar28 + (borg_grids[(long)ddy_ddd[lVar26] + (long)pbVar10[(uint)i].pos.y]
                             [(long)ddx_ddd[lVar26] + (long)pbVar10[(uint)i].pos.x].feat == '\x16');
          lVar26 = lVar26 + 1;
        } while (lVar26 != 8);
        if (uVar28 < 2) goto switchD_0020d99b_caseD_3;
      }
    }
    lVar26 = (long)borg_tp_other_n;
    borg_tp_other_index[lVar26] = i;
    borg_tp_other_y[lVar26] = (uint8_t)pbVar10[(uint)i].pos.y;
    borg_tp_other_x[lVar26] = (uint8_t)pbVar10[(uint)i].pos.x;
    borg_tp_other_n = borg_tp_other_n + 1;
    goto switchD_0020d99b_caseD_3;
  case L'.':
    lVar26 = 0;
    wVar20 = L'\0';
    iVar16 = borg_tp_other_n;
    do {
      if (borg_grids[(long)ddy_ddd[lVar26] + (long)pbVar10[(uint)i].pos.y]
          [(long)ddx_ddd[lVar26] + (long)pbVar10[(uint)i].pos.x].glyph == true) {
        borg_tp_other_index[iVar16] = i;
        borg_tp_other_y[iVar16] = (uint8_t)pbVar10[(uint)i].pos.y;
        borg_tp_other_x[iVar16] = (uint8_t)pbVar10[(uint)i].pos.x;
        borg_tp_other_n = iVar16 + 1;
        wVar20 = L'Ĭ';
        iVar16 = borg_tp_other_n;
      }
      lVar26 = lVar26 + 1;
    } while (lVar26 != 8);
    if ((morgoth_on_level == true) && (borg_morgoth_position == false)) {
      borg_tp_other_index[iVar16] = i;
      borg_tp_other_y[iVar16] = (uint8_t)pbVar10[(uint)i].pos.y;
      borg_tp_other_x[iVar16] = (uint8_t)pbVar10[(uint)i].pos.x;
      borg_tp_other_n = iVar16 + 1;
      wVar20 = L'd';
      iVar16 = borg_tp_other_n;
    }
    if (piVar12[0x1e] < 0x24) {
      borg_tp_other_index[iVar16] = i;
      borg_tp_other_y[iVar16] = (uint8_t)pbVar10[(uint)i].pos.y;
      borg_tp_other_x[iVar16] = (uint8_t)pbVar10[(uint)i].pos.x;
      borg_tp_other_n = iVar16 + 1;
      wVar20 = L'\x96';
    }
    break;
  case L'/':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    if (_Var13) goto switchD_0020d99b_caseD_22;
LAB_0020eabe:
    wVar20 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
    break;
  case L'0':
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,0x51,"r_ptr->flags","RF_NO_CONF");
    wVar20 = L'\0';
    if (((!_Var13) && (_Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), !_Var13)
        ) && ((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed &&
              ((pbVar10[(uint)i].confused == false && (pbVar10[(uint)i].awake == true)))))) {
      iVar24 = 10;
      if (0xc < borg.trait[0x23]) {
        iVar24 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
      }
      if (pbVar10[(uint)i].level <= iVar24) {
        _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar20 = L'\xfffffc19';
        if (!_Var13) {
          p_Var25 = &borg_confuse_spell;
          goto LAB_0020ea33;
        }
      }
    }
    break;
  case L'1':
    wVar20 = L'\0';
    if (r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x4f,"r_ptr->flags","RF_NO_FEAR");
      if (((!_Var13) && (pbVar10[(uint)i].confused == false)) && (pbVar10[(uint)i].awake == true)) {
        iVar24 = 10;
        if (0xc < borg.trait[0x23]) {
          iVar24 = (borg.trait[0x23] - 10U >> 2) * 3 + 10;
        }
        if (pbVar10[(uint)i].level <= iVar24) {
          _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
          wVar20 = L'\xfffffc19';
          if (!_Var13) {
            p_Var25 = &borg_fear_mon_spell;
            goto LAB_0020ea33;
          }
        }
      }
    }
    break;
  case L'2':
    wVar20 = L'\0';
    if (((r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed) &&
        (pbVar10[(uint)i].confused == false)) && (pbVar10[(uint)i].awake == true)) {
      iVar24 = 10;
      if (0xc < piVar12[0x23]) {
        iVar24 = (piVar12[0x23] - 10U >> 2) * 3 + 10;
      }
      if (pbVar10[(uint)i].level <= iVar24) {
        _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
        wVar20 = L'\xfffffc19';
        if (!_Var13) {
          p_Var25 = &borg_slow_spell;
          goto LAB_0020ea33;
        }
      }
    }
    break;
  case L'4':
    iVar24 = 10;
    if (0xc < piVar12[0x23]) {
      iVar24 = (piVar12[0x23] - 10U >> 2) * 3 + 10;
    }
    if (iVar24 < pbVar10[(uint)i].level) goto switchD_0020d99b_caseD_22;
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar20 = L'\xfffffc19';
    if (((!_Var13) &&
        (wVar21 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x02',i,true,true), wVar20 = wVar21,
        wVar21 < avoidance * 2)) && (wVar20 = L'\0', pbVar10[(uint)i].afraid != false)) {
      wVar20 = wVar21;
    }
    break;
  case L'5':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    wVar20 = L'\0';
    if ((((_Var13) && (pbVar10[(uint)i].confused == false)) &&
        (r_ptr->speed + L'\xfffffffb' <= (int)(uint)pbVar10[(uint)i].speed)) &&
       ((pbVar10[(uint)i].awake == true && ((int)pbVar10[(uint)i].level <= borg.trait[0x23] + -5))))
    {
      borg_fear_mon_spell = false;
      wVar21 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
      borg_fear_mon_spell = true;
      wVar17 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,true);
      borg_fear_mon_spell = false;
LAB_0020eab6:
      wVar20 = wVar21 - wVar17;
    }
    break;
  case L'6':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3d,"r_ptr->flags","RF_EVIL");
    wVar20 = L'\0';
    if (_Var13) {
      _Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE");
      if (!_Var13) goto LAB_0020eabe;
      if ((r_ptr->friends == (monster_friends *)0x0) &&
         (wVar20 = L'\xfffffe0c', r_ptr->friends_base != (monster_friends_base *)0x0)) {
        wVar20 = L'\0';
      }
    }
    break;
  case L'7':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    if (!_Var13) goto switchD_0020d99b_caseD_22;
    if (0 < pbVar10[(uint)i].power) {
      wVar20 = (int)pbVar10[(uint)i].power;
    }
    break;
  case L'8':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x3f,"r_ptr->flags","RF_NONLIVING");
    _Var14 = flag_has_dbg(r_ptr->flags,0xb,0x3e,"r_ptr->flags","RF_UNDEAD");
    bVar15 = _Var14 && _Var13;
    goto LAB_0020e75f;
  case L'9':
    _Var13 = flag_has_dbg(r_ptr->flags,0xb,0x46,"r_ptr->flags","RF_IM_ELEC");
    if (_Var13) goto switchD_0020d99b_caseD_22;
    if (borg_grids[pbVar10[(uint)i].pos.y][pbVar10[(uint)i].pos.x].feat == '\0') {
      wVar20 = L'\0';
    }
    break;
  case L':':
    iVar24 = (pbVar10[(uint)i].injury + 0x33) * (piVar12[0x23] / 0xc);
    iVar24 = iVar24 - (iVar24 >> 0x1f);
LAB_0020dd39:
    wVar20 = iVar24 >> 1;
  }
  if (borg.trait[0x69] < 1) {
LAB_0020ecc2:
    bVar23 = false;
  }
  else {
    wVar21 = borg_danger_one_kill(pbVar10[(uint)i].pos.y,pbVar10[(uint)i].pos.x,L'\x01',i,true,true)
    ;
    if ((wVar21 <= (int)avoidance / 5) &&
       ((((r_ptr->friends == (monster_friends *)0x0 &&
          (r_ptr->friends_base == (monster_friends_base *)0x0)) ||
         ((int)pbVar10[(uint)i].level < borg.trait[0x23] + -5)) &&
        (pbVar10[(uint)i].ranged_attack == '\0')))) {
      pbVar1 = r_ptr->flags;
      _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
      if ((((!_Var13) &&
           (_Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY"), !_Var13 && !bVar23)
           ) && (_Var13 = flag_has_dbg(pbVar1,0xb,0x15,"r_ptr->flags","RF_NEVER_MOVE"), !_Var13)) &&
         (0x14 < borg.trait[0x23])) goto LAB_0020ecc2;
    }
    bVar23 = true;
  }
  if ((0x36 < (uint)typ) || ((0x40600000000000U >> ((ulong)(uint)typ & 0x3f) & 1) == 0)) {
    if ((pbVar10[(uint)i].power * 2 < wVar20) &&
       (_Var13 = flag_has_dbg(r_ptr->flags,0xb,1,"r_ptr->flags","RF_UNIQUE"), !_Var13)) {
      wVar20 = pbVar10[(uint)i].power * 2;
    }
    pbVar1 = r_ptr->flags;
    _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar21 = wVar20;
    if ((_Var13) && (wVar21 = wVar20 * 3, borg.trait[0x69] < 1)) {
      wVar21 = wVar20;
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,1,"r_ptr->flags","RF_UNIQUE");
    wVar17 = wVar21;
    if ((_Var13) && (borg.trait[0x69] == 0)) {
      wVar17 = L'\0';
      if (4 < borg.trait[0x23]) {
        wVar17 = (wVar21 * 2) / 3;
      }
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,0x11,"r_ptr->flags","RF_MULTIPLY");
    if (_Var13) {
      wVar17 = (wVar17 * 3) / 2;
    }
    flags = r_ptr->spell_flags;
    _Var13 = flag_has_dbg(flags,0xc,0x4c,"r_ptr->spell_flags","RSF_S_KIN");
    if ((((((_Var13) ||
           (_Var13 = flag_has_dbg(flags,0xc,0x4d,"r_ptr->spell_flags","RSF_S_HI_DEMON"), _Var13)) ||
          (_Var13 = flag_has_dbg(flags,0xc,0x4e,"r_ptr->spell_flags","RSF_S_MONSTER"), _Var13)) ||
         (((_Var13 = flag_has_dbg(flags,0xc,0x4f,"r_ptr->spell_flags","RSF_S_MONSTERS"), _Var13 ||
           (_Var13 = flag_has_dbg(flags,0xc,0x50,"r_ptr->spell_flags","RSF_S_ANIMAL"), _Var13)) ||
          ((_Var13 = flag_has_dbg(flags,0xc,0x51,"r_ptr->spell_flags","RSF_S_SPIDER"), _Var13 ||
           ((_Var13 = flag_has_dbg(flags,0xc,0x52,"r_ptr->spell_flags","RSF_S_HOUND"), _Var13 ||
            (_Var13 = flag_has_dbg(flags,0xc,0x53,"r_ptr->spell_flags","RSF_S_HYDRA"), _Var13)))))))
         ) || ((_Var13 = flag_has_dbg(flags,0xc,0x54,"r_ptr->spell_flags","RSF_S_AINU"), _Var13 ||
               (((_Var13 = flag_has_dbg(flags,0xc,0x55,"r_ptr->spell_flags","RSF_S_DEMON"), _Var13
                 || (_Var13 = flag_has_dbg(flags,0xc,0x56,"r_ptr->spell_flags","RSF_S_UNDEAD"),
                    _Var13)) ||
                (_Var13 = flag_has_dbg(flags,0xc,0x57,"r_ptr->spell_flags","RSF_S_DRAGON"), _Var13))
               )))) ||
       (((_Var13 = flag_has_dbg(flags,0xc,0x59,"r_ptr->spell_flags","RSF_S_HI_DRAGON"), _Var13 ||
         (_Var13 = flag_has_dbg(flags,0xc,0x58,"r_ptr->spell_flags","RSF_S_HI_UNDEAD"), _Var13)) ||
        ((_Var13 = flag_has_dbg(flags,0xc,0x5a,"r_ptr->spell_flags","RSF_S_WRAITH"), _Var13 ||
         (_Var13 = flag_has_dbg(flags,0xc,0x5b,"r_ptr->spell_flags","RSF_S_UNIQUE"), _Var13)))))) {
      wVar17 = (wVar17 * 3) / 2 + wVar17;
    }
    _Var13 = flag_has_dbg(pbVar1,0xb,2,"r_ptr->flags","RF_QUESTOR");
    wVar21 = wVar17 * 10;
    if (!_Var13) {
      wVar21 = wVar17;
    }
    wVar20 = L'\0';
    if (bVar23) {
      wVar20 = wVar21;
    }
    if (typ != L'\x01') {
      wVar20 = wVar21;
    }
  }
  if (L'\0' < wVar20) {
    if (((uint)typ < 0x37) && ((0x40600000000000U >> ((ulong)(uint)typ & 0x3f) & 1) != 0)) {
      return wVar20;
    }
    wVar21 = borg_danger_one_kill(local_58,local_50,L'\x01',i,true,false);
    if (pbVar9[(uint)i].awake == false) {
      if ((((int)(short)(avoidance - (avoidance >> 0xf)) >> 1 < wVar21) &&
          (wVar20 < pbVar9[(uint)i].power)) && (borg.munchkin_mode != true)) {
        return L'\xfffffc19';
      }
      if (borg.trait[0x69] == 0) {
        return L'\0';
      }
    }
    wVar21 = borg_danger_one_kill(borg.c.y,borg.c.x,L'\x01',i,true,false);
    return (wVar20 << (pbVar9[(uint)i].power <= wVar20)) + wVar21;
  }
  return wVar20;
}

Assistant:

static int borg_launch_bolt_aux_hack(int i, int dam, int typ, int ammo_location)
{
    int d, p2, p1, x, y;
    int o_y     = 0;
    int o_x     = 0;
    int walls   = 0;
    int unknown = 0;

    borg_grid *ag;

    borg_kill *kill;

    struct monster_race *r_ptr;

    /* Monster */
    kill = &borg_kills[i];

    /* monster race */
    r_ptr = &r_info[kill->r_idx];

    /* Skip dead monsters */
    if (!kill->r_idx)
        return 0;

    /* "player ghosts" */
    if (kill->r_idx >= z_info->r_max - 1)
        return 0;

    /* Require current knowledge */
    if (kill->when < borg_t - 2)
        return 0;

    /* Acquire location */
    x = kill->pos.x;
    y = kill->pos.y;

    /* Acquire the grid */
    ag = &borg_grids[y][x];

    /* Never shoot walls/doors */
    if (!borg_cave_floor_grid(ag))
        return 0;

    /* dont shoot at ghosts if not on known floor grid */
    if ((rf_has(r_ptr->flags, RF_PASS_WALL))
        && (ag->feat != FEAT_FLOOR && ag->feat != FEAT_OPEN
            && ag->feat != FEAT_BROKEN && !ag->trap))
        return 0;

    /* dont shoot at ghosts in walls, not perfect */
    if (rf_has(r_ptr->flags, RF_PASS_WALL)) {
        /* if 2 walls and 1 unknown skip this monster */
        /* Acquire location */
        x = kill->pos.x;
        y = kill->pos.y;

        /* Get grid */
        for (o_x = -1; o_x <= 1; o_x++) {
            for (o_y = -1; o_y <= 1; o_y++) {
                /* Acquire location */
                x  = kill->pos.x + o_x;
                y  = kill->pos.y + o_y;

                ag = &borg_grids[y][x];

                if (ag->feat >= FEAT_MAGMA && ag->feat <= FEAT_PERM)
                    walls++;
                if (ag->feat == FEAT_NONE)
                    unknown++;
            }
        }
        /* Is the ghost likely in a wall? */
        if (walls >= 2 && unknown >= 1)
            return 0;
    }

    /* Calculate damage */
    d = borg_launch_damage_one(i, dam, typ, ammo_location);

    /* Return Damage, on Teleport Other, true damage is
     * calculated elsewhere */
    if (typ == BORG_ATTACK_AWAY_ALL || typ == BORG_ATTACK_AWAY_ALL_MORGOTH)
        return d;

    /* Return Damage as pure danger of the monster */
    if (typ == BORG_ATTACK_AWAY_EVIL)
        return d;

    /* Return 0 if the true damage (w/o the danger bonus) is 0 */
    if (d <= 0)
        return d;

    /* Calculate danger */
    p2 = borg_danger_one_kill(y, x, 1, i, true, false);

    /* Hack -- avoid waking most "hard" sleeping monsters */
    if (!kill->awake && (p2 > avoidance / 2) && (d < kill->power)
        && !borg.munchkin_mode) {
        return (-999);
    }

    /* Hack -- ignore sleeping town monsters */
    if (!borg.trait[BI_CDEPTH] && !kill->awake) {
        return 0;
    }

    /* Hack -- ignore nonthreatening town monsters when low level */
    if (!borg.trait[BI_CDEPTH] && borg.trait[BI_CLEVEL] < 3
        /* && monster_is_nonthreatening_test */) {
        /* Nothing yet */
    }

    /* Calculate "danger" to player */
    p1 = borg_danger_one_kill(borg.c.y, borg.c.x, 1, i, true, false);

    /* Extra "bonus" if attack kills */
    if (d >= kill->power)
        d = 2 * d;

    /* Add in dangers */
    d = d + p1;

    /* Result */
    return d;
}